

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_ironskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected(ch,(int)gsn_ironskin);
  if (!bVar1) {
    bVar1 = is_affected(ch,(int)gsn_diamondskin);
    if (!bVar1) {
      bVar1 = is_affected(ch,(int)gsn_stoneskin);
      if (!bVar1) {
        act("Your skin hardens and takes on a metallic tone.",ch,(void *)0x0,(void *)0x0,3);
        act("$n\'s skin hardens and takes on a metallic tone.",ch,(void *)0x0,(void *)0x0,0);
        init_affect(&local_90);
        local_90.where = 0;
        local_90.aftype = 0;
        local_90.type = gsn_ironskin;
        uVar2 = level + 3;
        if (-1 < level) {
          uVar2 = level;
        }
        local_90.modifier = (short)(level / 3);
        local_90.location = 0x11;
        local_90.duration = (short)(uVar2 >> 2);
        local_90.end_fun = (AFF_FUN *)0x0;
        local_90.owner = ch;
        local_90.level = (short)level;
        new_affect_to_char(ch,&local_90);
        local_90.where = 4;
        local_90.location = 0;
        local_90.modifier = 0;
        local_90.mod_name = 0xc;
        local_90.bitvector[0]._1_1_ = local_90.bitvector[0]._1_1_ | 2;
        new_affect_to_char(ch,&local_90);
        return;
      }
    }
  }
  send_to_char("Your skin is already magically hardened.\n\r",ch);
  return;
}

Assistant:

void spell_ironskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_ironskin) || is_affected(ch, gsn_diamondskin) || is_affected(ch, gsn_stoneskin))
	{
		send_to_char("Your skin is already magically hardened.\n\r", ch);
		return;
	}

	act("Your skin hardens and takes on a metallic tone.", ch, 0, 0, TO_CHAR);
	act("$n's skin hardens and takes on a metallic tone.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_ironskin;
	af.owner = ch;
	af.level = level;
	af.location = APPLY_AC;
	af.modifier = level / 3;
	af.duration = level / 4;
	af.end_fun = nullptr;
	new_affect_to_char(ch, &af);

	af.where = TO_VULN;
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, VULN_LIGHTNING);
	new_affect_to_char(ch, &af);
}